

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_colorf nk_color_cf(nk_color in)

{
  nk_colorf nVar1;
  
  nVar1.r = (float)((uint)in & 0xff) * 0.003921569;
  nVar1.g = (float)((uint)in >> 8 & 0xff) * 0.003921569;
  nVar1.b = (float)((uint)in >> 0x10 & 0xff) * 0.003921569;
  nVar1.a = (float)((uint)in >> 0x18) * 0.003921569;
  return nVar1;
}

Assistant:

NK_API struct nk_colorf
nk_color_cf(struct nk_color in)
{
    struct nk_colorf o;
    nk_color_f(&o.r, &o.g, &o.b, &o.a, in);
    return o;
}